

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O0

int __thiscall Nova::Parse_Args::Find_Match(Parse_Args *this,string *str)

{
  __type _Var1;
  size_type sVar2;
  const_reference pvVar3;
  int local_24;
  int i;
  string *str_local;
  Parse_Args *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::size(&this->arg_data_list)
    ;
    if (sVar2 <= (ulong)(long)local_24) {
      return -1;
    }
    pvVar3 = std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::operator[]
                       (&this->arg_data_list,(long)local_24);
    _Var1 = std::operator==(&pvVar3->str,str);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int Parse_Args::
Find_Match(const std::string& str) const
{
    for(int i=0;i<arg_data_list.size();i++) if(arg_data_list[i].str==str) return i;
    return -1;
}